

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdExtension.hpp
# Opt level: O0

ostream * std::operator<<(ostream *os,vector<unsigned_long,_std::allocator<unsigned_long>_> *v)

{
  bool bVar1;
  ostream *poVar2;
  const_reference pvVar3;
  size_type sVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RSI;
  ostream *in_RDI;
  size_t i;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffffe0;
  ulong uVar5;
  ulong __n;
  ostream *local_8;
  
  bVar1 = vector<unsigned_long,_std::allocator<unsigned_long>_>::empty(in_stack_ffffffffffffffe0);
  if (bVar1) {
    local_8 = std::operator<<(in_RDI,"[]");
  }
  else {
    poVar2 = std::operator<<(in_RDI,"[");
    pvVar3 = vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,0);
    std::ostream::operator<<(poVar2,*pvVar3);
    uVar5 = 1;
    while( true ) {
      __n = uVar5;
      sVar4 = vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RSI);
      if (sVar4 <= uVar5) break;
      poVar2 = std::operator<<(in_RDI,", ");
      pvVar3 = vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[](in_RSI,__n);
      std::ostream::operator<<(poVar2,*pvVar3);
      uVar5 = __n + 1;
    }
    std::operator<<(in_RDI,"]");
    local_8 = in_RDI;
  }
  return local_8;
}

Assistant:

ostream& operator << (ostream& os, const vector<T>& v) {
  if(v.empty()) {
    return os << "[]";
  }
  os<<"["<<v[0];
  for(size_t i = 1; i < v.size(); i++) {
    os<<", "<<v[i];
  }
  os<<"]";
  return os;
}